

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall Matrix::transpose(Matrix *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  HighsInt row;
  long lVar4;
  long lVar5;
  double val;
  int local_64;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  row_values;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  row_indices;
  
  if (this->has_transpose == false) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&row_indices,(long)(this->mat).num_row,(allocator_type *)&row_values);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&row_values,(long)(this->mat).num_row,(allocator_type *)&val);
    for (local_64 = 0; local_64 < (this->mat).num_col; local_64 = local_64 + 1) {
      piVar3 = (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = (long)piVar3[local_64]; lVar4 < piVar3[(long)local_64 + 1]; lVar4 = lVar4 + 1) {
        iVar1 = (this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        val = (this->mat).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
        std::vector<int,_std::allocator<int>_>::push_back
                  (row_indices.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar1,&local_64);
        std::vector<double,_std::allocator<double>_>::push_back
                  (row_values.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar1,&val);
        piVar3 = (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    piVar3 = (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    piVar3 = (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    this_00 = &(this->tran).start;
    pdVar2 = (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar2;
    }
    std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)(this->mat).num_row + 1);
    this_01 = &(this->tran).index;
    std::vector<int,_std::allocator<int>_>::reserve
              (this_01,(long)(this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2);
    this_02 = &(this->tran).value;
    std::vector<double,_std::allocator<double>_>::reserve
              (this_02,(long)(this->mat).value.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->mat).value.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    val = (double)((ulong)val & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&val);
    lVar4 = 2;
    for (lVar5 = 0; iVar1 = (this->mat).num_row, lVar5 < iVar1; lVar5 = lVar5 + 1) {
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)this_01,
                 (const_iterator)
                 (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 *(int **)((long)row_indices.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar4 * 4 + -8),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 *(int **)((long)&((row_indices.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar4 * 4));
      std::vector<double,std::allocator<double>>::
      insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,std::allocator<double>> *)this_02,
                 (const_iterator)
                 (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 *(double **)
                  ((long)row_values.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4 * 4 + -8),
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 *(double **)
                  ((long)&((row_values.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar4 * 4));
      val = (double)CONCAT44(val._4_4_,
                             (int)((ulong)(*(long *)((long)&((row_indices.
                                                                                                                            
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  lVar4 * 4) -
                                          *(long *)((long)row_indices.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar4 * 4 + -8)) >> 2) +
                             (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&val);
      lVar4 = lVar4 + 6;
    }
    (this->tran).num_col = iVar1;
    (this->tran).num_row = (this->mat).num_col;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&row_values);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&row_indices);
  }
  return;
}

Assistant:

void transpose() {
    if (!has_transpose) {
      std::vector<std::vector<HighsInt>> row_indices(mat.num_row);
      std::vector<std::vector<double>> row_values(mat.num_row);

      for (HighsInt col = 0; col < mat.num_col; col++) {
        for (HighsInt entry = mat.start[col]; entry < mat.start[col + 1];
             entry++) {
          HighsInt row = mat.index[entry];
          double val = mat.value[entry];
          row_indices[row].push_back(col);
          row_values[row].push_back(val);
        }
      }
      tran.start.clear();
      tran.index.clear();
      tran.value.clear();
      tran.start.reserve(mat.num_row + 1);
      tran.index.reserve(mat.index.size());
      tran.value.reserve(mat.value.size());

      tran.start.push_back(0);
      for (HighsInt row = 0; row < mat.num_row; row++) {
        tran.index.insert(tran.index.end(), row_indices[row].begin(),
                          row_indices[row].end());
        tran.value.insert(tran.value.end(), row_values[row].begin(),
                          row_values[row].end());

        tran.start.push_back(tran.start[row] + row_indices[row].size());
      }

      tran.num_col = mat.num_row;
      tran.num_row = mat.num_col;
    }
  }